

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall Fl_Text_Display::offset_line_starts(Fl_Text_Display *this,int newTopLineNum)

{
  int oldFirstChar_00;
  int endLine;
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fl_Text_Buffer *buf;
  int lastLineNum;
  int i;
  int *lineStarts;
  int nVisLines;
  int lineDelta;
  int oldFirstChar;
  int oldTopLineNum;
  int newTopLineNum_local;
  Fl_Text_Display *this_local;
  
  iVar3 = this->mTopLineNum;
  oldFirstChar_00 = this->mFirstChar;
  iVar4 = newTopLineNum - iVar3;
  endLine = this->mNVisibleLines;
  piVar1 = this->mLineStarts;
  if (iVar4 != 0) {
    iVar2 = iVar3 + endLine + -1;
    if ((newTopLineNum < iVar3) && (SBORROW4(newTopLineNum,-iVar4) != newTopLineNum + iVar4 < 0)) {
      iVar3 = skip_lines(this,0,newTopLineNum + -1,true);
      this->mFirstChar = iVar3;
    }
    else if (newTopLineNum < iVar3) {
      iVar3 = rewind_lines(this,this->mFirstChar,-iVar4);
      this->mFirstChar = iVar3;
    }
    else if (newTopLineNum < iVar2) {
      this->mFirstChar = piVar1[newTopLineNum - iVar3];
    }
    else if (newTopLineNum - iVar2 < this->mNBufferLines - newTopLineNum) {
      iVar3 = skip_lines(this,piVar1[endLine + -1],newTopLineNum - iVar2,true);
      this->mFirstChar = iVar3;
    }
    else {
      iVar3 = Fl_Text_Buffer::length(this->mBuffer);
      iVar3 = rewind_lines(this,iVar3,(this->mNBufferLines - newTopLineNum) + 1);
      this->mFirstChar = iVar3;
    }
    if ((iVar4 < 0) && (-iVar4 < endLine)) {
      while (buf._4_4_ = endLine + -1, SBORROW4(buf._4_4_,-iVar4) == buf._4_4_ + iVar4 < 0) {
        piVar1[buf._4_4_] = piVar1[buf._4_4_ + iVar4];
        endLine = buf._4_4_;
      }
      calc_line_starts(this,0,-iVar4);
    }
    else if ((iVar4 < 1) || (endLine <= iVar4)) {
      calc_line_starts(this,0,endLine);
    }
    else {
      for (buf._4_4_ = 0; buf._4_4_ < endLine - iVar4; buf._4_4_ = buf._4_4_ + 1) {
        piVar1[buf._4_4_] = piVar1[buf._4_4_ + iVar4];
      }
      calc_line_starts(this,endLine - iVar4,endLine + -1);
    }
    calc_last_char(this);
    this->mTopLineNum = newTopLineNum;
    absolute_top_line_number(this,oldFirstChar_00);
  }
  return;
}

Assistant:

void Fl_Text_Display::offset_line_starts( int newTopLineNum ) {
  int oldTopLineNum = mTopLineNum;
  int oldFirstChar = mFirstChar;
  int lineDelta = newTopLineNum - oldTopLineNum;
  int nVisLines = mNVisibleLines;
  int *lineStarts = mLineStarts;
  int i, lastLineNum;
  Fl_Text_Buffer *buf = mBuffer;

  /* If there was no offset, nothing needs to be changed */
  if ( lineDelta == 0 )
    return;

  /* Find the new value for mFirstChar by counting lines from the nearest
   known line start (start or end of buffer, or the closest value in the
   lineStarts array) */
  lastLineNum = oldTopLineNum + nVisLines - 1;
  if ( newTopLineNum < oldTopLineNum && newTopLineNum < -lineDelta ) {
    mFirstChar = skip_lines( 0, newTopLineNum - 1, true );
  } else if ( newTopLineNum < oldTopLineNum ) {
    mFirstChar = rewind_lines( mFirstChar, -lineDelta );
  } else if ( newTopLineNum < lastLineNum ) {
    mFirstChar = lineStarts[ newTopLineNum - oldTopLineNum ];
  } else if ( newTopLineNum - lastLineNum < mNBufferLines - newTopLineNum ) {
    mFirstChar = skip_lines( lineStarts[ nVisLines - 1 ],
                            newTopLineNum - lastLineNum, true );
  } else {
    mFirstChar = rewind_lines( buf->length(), mNBufferLines - newTopLineNum + 1 );
  }

  /* Fill in the line starts array */
  if ( lineDelta < 0 && -lineDelta < nVisLines ) {
    for ( i = nVisLines - 1; i >= -lineDelta; i-- )
      lineStarts[ i ] = lineStarts[ i + lineDelta ];
    calc_line_starts( 0, -lineDelta );
  } else if ( lineDelta > 0 && lineDelta < nVisLines ) {
    for ( i = 0; i < nVisLines - lineDelta; i++ )
      lineStarts[ i ] = lineStarts[ i + lineDelta ];
    calc_line_starts( nVisLines - lineDelta, nVisLines - 1 );
  } else
    calc_line_starts( 0, nVisLines );

  /* Set lastChar and mTopLineNum */
  calc_last_char();
  mTopLineNum = newTopLineNum;

  /* If we're numbering lines or being asked to maintain an absolute line
   number, re-calculate the absolute line number */
  absolute_top_line_number(oldFirstChar);
}